

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnImportGlobal
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index global_index,Type type,bool mutable_)

{
  Module *this_00;
  byte bVar1;
  pointer pGVar2;
  Location local_b8;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_98;
  string local_90;
  string local_70;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> local_50;
  unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_> import;
  bool mutable__local;
  Index import_index_local;
  BinaryReaderIR *this_local;
  undefined1 auStack_30 [4];
  Type type_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local.data_ = (char *)field_name.size_;
  _auStack_30 = field_name.data_;
  module_name_local.data_ = (char *)module_name.size_;
  field_name_local.size_ = (size_type)module_name.data_;
  import._M_t.super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
  super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._3_1_ = mutable_;
  import._M_t.super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
  super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._4_4_ = import_index;
  MakeUnique<wabt::GlobalImport>();
  string_view::to_string_abi_cxx11_(&local_70,(string_view *)&field_name_local.size_);
  pGVar2 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     (&local_50);
  std::__cxx11::string::operator=
            ((string *)&(pGVar2->super_ImportMixin<(wabt::ExternalKind)3>).super_Import.module_name,
             (string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  string_view::to_string_abi_cxx11_(&local_90,(string_view *)auStack_30);
  pGVar2 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     (&local_50);
  std::__cxx11::string::operator=
            ((string *)&(pGVar2->super_ImportMixin<(wabt::ExternalKind)3>).super_Import.field_name,
             (string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  pGVar2 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     (&local_50);
  bVar1 = import._M_t.
          super___uniq_ptr_impl<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::GlobalImport_*,_std::default_delete<wabt::GlobalImport>_>.
          super__Head_base<0UL,_wabt::GlobalImport_*,_false>._M_head_impl._3_1_;
  (pGVar2->global).type.enum_ = type.enum_;
  pGVar2 = std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::operator->
                     (&local_50);
  (pGVar2->global).mutable_ = (bool)(bVar1 & 1);
  this_00 = this->module_;
  GetLocation(&local_b8,this);
  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::GlobalImport,std::default_delete<wabt::GlobalImport>>,wabt::Location>
            ((wabt *)&local_98,&local_50,&local_b8);
  Module::AppendField(this_00,&local_98);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr(&local_98);
  Result::Result((Result *)((long)&module_name_local.size_ + 4),Ok);
  std::unique_ptr<wabt::GlobalImport,_std::default_delete<wabt::GlobalImport>_>::~unique_ptr
            (&local_50);
  return (Result)module_name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportGlobal(Index import_index,
                                      string_view module_name,
                                      string_view field_name,
                                      Index global_index,
                                      Type type,
                                      bool mutable_) {
  auto import = MakeUnique<GlobalImport>();
  import->module_name = module_name.to_string();
  import->field_name = field_name.to_string();
  import->global.type = type;
  import->global.mutable_ = mutable_;
  module_->AppendField(
      MakeUnique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}